

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf.h
# Opt level: O0

vec3 * __thiscall cosine_pdf::generate(vec3 *__return_storage_ptr__,cosine_pdf *this)

{
  vec3 local_28;
  cosine_pdf *local_10;
  cosine_pdf *this_local;
  
  local_10 = this;
  random_cosine_direction();
  onb::transform(__return_storage_ptr__,&this->uvw,&local_28);
  return __return_storage_ptr__;
}

Assistant:

vec3 generate() const override {
        return uvw.transform(random_cosine_direction());
    }